

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O1

void __thiscall Movegen::generate<(Movetype)16,(Piece)0>(Movegen *this)

{
  Color CVar1;
  long lVar2;
  U8 UVar3;
  code *pcVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  U8 *pUVar8;
  U8 UVar9;
  code *pcVar10;
  char cVar11;
  U64 caps_r;
  U64 caps_l;
  ulong local_30;
  ulong local_28;
  
  local_28 = 0;
  local_30 = 0;
  CVar1 = this->us;
  uVar7 = this->pawns7;
  if (uVar7 != 0) {
    uVar6 = (long)(int)CVar1 ^ 1;
    local_30 = (&bitboards::pawnmaskright)[uVar6] & uVar7;
    pcVar10 = anon_unknown.dwarf_96d6f::shift<(Dir)7>;
    if (CVar1 == white) {
      pcVar10 = anon_unknown.dwarf_96d6f::shift<(Dir)4>;
    }
    local_28 = uVar7 & (&bitboards::pawnmaskleft)[uVar6];
    if (local_28 != 0) {
      pcVar4 = anon_unknown.dwarf_96d6f::shift<(Dir)6>;
      if (CVar1 == white) {
        pcVar4 = anon_unknown.dwarf_96d6f::shift<(Dir)5>;
      }
      (*pcVar4)(&local_28);
      local_28 = local_28 & this->ctarget;
    }
    if (local_30 != 0) {
      (*pcVar10)(&local_30);
      local_30 = local_30 & this->ctarget;
    }
  }
  cVar11 = ((long)(int)CVar1 != 0U) * '\x10';
  if (local_30 != 0) {
    uVar7 = (ulong)this->last;
    pUVar8 = &this->list[uVar7 + 3].type;
    do {
      lVar2 = 0;
      if (local_30 != 0) {
        for (; (local_30 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      UVar3 = (U8)lVar2;
      UVar9 = cVar11 + -7 + UVar3;
      pUVar8[-0xb] = UVar9;
      pUVar8[-10] = UVar3;
      pUVar8[-9] = 4;
      pUVar8[-8] = UVar9;
      pUVar8[-7] = UVar3;
      pUVar8[-6] = 5;
      pUVar8[-5] = UVar9;
      pUVar8[-4] = UVar3;
      pUVar8[-3] = 6;
      ((Move *)(pUVar8 + -2))->f = UVar9;
      pUVar8[-1] = UVar3;
      *pUVar8 = '\a';
      pUVar8 = pUVar8 + 0xc;
      uVar5 = (int)uVar7 + 4;
      uVar7 = (ulong)uVar5;
      local_30 = local_30 - 1 & local_30;
    } while (local_30 != 0);
    this->last = uVar5;
  }
  if (local_28 != 0) {
    uVar7 = (ulong)this->last;
    pUVar8 = &this->list[uVar7 + 3].type;
    do {
      lVar2 = 0;
      if (local_28 != 0) {
        for (; (local_28 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      UVar3 = (U8)lVar2;
      UVar9 = cVar11 + -9 + UVar3;
      pUVar8[-0xb] = UVar9;
      pUVar8[-10] = UVar3;
      pUVar8[-9] = 4;
      pUVar8[-8] = UVar9;
      pUVar8[-7] = UVar3;
      pUVar8[-6] = 5;
      pUVar8[-5] = UVar9;
      pUVar8[-4] = UVar3;
      pUVar8[-3] = 6;
      ((Move *)(pUVar8 + -2))->f = UVar9;
      pUVar8[-1] = UVar3;
      *pUVar8 = '\a';
      pUVar8 = pUVar8 + 0xc;
      uVar5 = (int)uVar7 + 4;
      uVar7 = (ulong)uVar5;
      local_28 = local_28 - 1 & local_28;
    } while (local_28 != 0);
    this->last = uVar5;
  }
  return;
}

Assistant:

inline void Movegen::generate<capture_promotion, pawn>() {
	U64 caps_l = 0;
	U64 caps_r = 0;
	int d1 = (us == white ? -7 : 9);
	int d2 = (us == white ? -9 : 7);
	capture_promotions(caps_r, caps_l);
	if (caps_r != 0ULL) encode_capture_promotions(caps_r, d1);
	if (caps_l != 0ULL) encode_capture_promotions(caps_l, d2);
}